

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmanonfn.h
# Opt level: O2

int __thiscall CVmObjAnonFn::is_of_metaclass(CVmObjAnonFn *this,CVmMetaclass *meta)

{
  int iVar1;
  
  if (metaclass_reg_ != meta) {
    iVar1 = CVmObjVector::is_of_metaclass(&this->super_CVmObjVector,meta);
    return (uint)(iVar1 != 0);
  }
  return 1;
}

Assistant:

virtual int is_of_metaclass(class CVmMetaclass *meta) const
    {
        /* try my own metaclass and my base class */
        return (meta == metaclass_reg_
                || CVmObjVector::is_of_metaclass(meta));
    }